

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformBlockTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::UniformBlockTests::init(UniformBlockTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  DataType DVar2;
  bool bVar3;
  int extraout_EAX;
  TestNode *pTVar4;
  char *pcVar5;
  TestNode *pTVar6;
  BlockSingleStructCase *pBVar7;
  BlockSingleStructArrayCase *pBVar8;
  BlockSingleNestedStructCase *pBVar9;
  BlockSingleNestedStructArrayCase *pBVar10;
  BlockMultiBasicTypesCase *pBVar11;
  BlockMultiNestedStructCase *pBVar12;
  TestCaseGroup *randomGroup;
  deUint32 allFeatures;
  deUint32 matFlags;
  deUint32 unused;
  deUint32 allBasicTypes;
  deUint32 allLayouts;
  deUint32 allShaders;
  undefined1 local_821;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  undefined1 local_7f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  undefined1 local_7d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  deUint32 local_7b0;
  allocator<char> local_7a9;
  deUint32 baseFlags_5;
  string baseName_5;
  int isArray_5;
  int layoutFlagNdx_8;
  TestCaseGroup *modeGroup_5;
  int modeNdx_5;
  TestCaseGroup *multiNestedStructGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  undefined1 local_739;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  undefined1 local_711;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  undefined1 local_6e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  deUint32 local_6c8;
  allocator<char> local_6c1;
  deUint32 baseFlags_4;
  string baseName_4;
  int isArray_4;
  int layoutFlagNdx_7;
  TestCaseGroup *modeGroup_4;
  int modeNdx_4;
  TestCaseGroup *multiBasicTypesGroup;
  allocator<char> local_661;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  int local_5fc;
  int matFlagNdx_2;
  undefined4 local_5dc;
  char *pcStack_5d8;
  int numInstances;
  char *typeName_2;
  DataType type_2;
  int basicTypeNdx_2;
  TestCaseGroup *layoutGroup_2;
  TestNode *pTStack_5b8;
  int layoutFlagNdx_6;
  TestCaseGroup *instanceArrayBasicTypeGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  undefined1 local_581;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  undefined1 local_559;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  deUint32 local_538;
  allocator<char> local_531;
  deUint32 baseFlags_3;
  string baseName_3;
  int isArray_3;
  int layoutFlagNdx_5;
  TestCaseGroup *modeGroup_3;
  int modeNdx_3;
  TestCaseGroup *singleNestedStructArrayGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  undefined1 local_4c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  undefined1 local_499;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  deUint32 local_478;
  allocator<char> local_471;
  deUint32 baseFlags_2;
  string baseName_2;
  int isArray_2;
  int layoutFlagNdx_4;
  TestCaseGroup *modeGroup_2;
  int modeNdx_2;
  TestCaseGroup *singleNestedStructGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  undefined1 local_401;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  undefined1 local_3d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  deUint32 local_3b8;
  allocator<char> local_3b1;
  deUint32 baseFlags_1;
  string baseName_1;
  int isArray_1;
  int layoutFlagNdx_3;
  TestCaseGroup *modeGroup_1;
  int modeNdx_1;
  TestCaseGroup *singleStructArrayGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  undefined1 local_341;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  undefined1 local_319;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  undefined4 local_2f4;
  deUint32 local_2f0;
  allocator<char> local_2e9;
  deUint32 baseFlags;
  string baseName;
  int isArray;
  int layoutFlagNdx_2;
  TestCaseGroup *modeGroup;
  int modeNdx;
  TestCaseGroup *singleStructGroup;
  VarType local_290;
  allocator<char> local_271;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  int local_20c;
  int matFlagNdx_1;
  VarType local_1f0;
  undefined4 local_1d4;
  char *pcStack_1d0;
  int arraySize;
  char *typeName_1;
  DataType type_1;
  int basicTypeNdx_1;
  TestCaseGroup *layoutGroup_1;
  TestNode *pTStack_1b0;
  int layoutFlagNdx_1;
  TestCaseGroup *singleBasicArrayGroup;
  allocator<char> local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  int local_e8;
  int local_e4;
  int precNdx_1;
  int matFlagNdx;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  int local_5c;
  int precNdx;
  char *local_40;
  char *typeName;
  DataType type;
  int basicTypeNdx;
  TestCaseGroup *layoutGroup;
  int layoutFlagNdx;
  TestNode *local_18;
  TestCaseGroup *singleBasicTypeGroup;
  UniformBlockTests *this_local;
  
  singleBasicTypeGroup = (TestCaseGroup *)this;
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_basic_type","Single basic variable in single buffer");
  local_18 = pTVar4;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  for (layoutGroup._0_4_ = 0; (int)layoutGroup < 3; layoutGroup._0_4_ = (int)layoutGroup + 1) {
    pTVar4 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::layoutFlags[(int)layoutGroup].name,"");
    _type = pTVar4;
    tcu::TestNode::addChild(local_18,pTVar4);
    for (typeName._4_4_ = 0; typeName._4_4_ < 0x19; typeName._4_4_ = typeName._4_4_ + 1) {
      typeName._0_4_ = init::basicTypes[typeName._4_4_];
      local_40 = glu::getDataTypeName((DataType)typeName);
      bVar3 = glu::isDataTypeBoolOrBVec((DataType)typeName);
      pTVar4 = _type;
      pcVar5 = local_40;
      if (bVar3) {
        pCVar1 = (this->super_TestCaseGroup).m_context;
        deqp::gls::ub::VarType::VarType((VarType *)&stack0xffffffffffffffa8,(DataType)typeName,0);
        createBlockBasicTypeCases
                  ((TestCaseGroup *)pTVar4,pCVar1,pcVar5,(VarType *)&stack0xffffffffffffffa8,
                   init::layoutFlags[(int)layoutGroup].flags,0);
        deqp::gls::ub::VarType::~VarType((VarType *)&stack0xffffffffffffffa8);
      }
      else {
        for (local_5c = 0; pTVar4 = _type, local_5c < 3; local_5c = local_5c + 1) {
          pCVar1 = (this->super_TestCaseGroup).m_context;
          pcVar5 = init::precisionFlags[local_5c].name;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,pcVar5,&local_c1);
          std::operator+(&local_a0,&local_c0,"_");
          std::operator+(&local_80,&local_a0,local_40);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          deqp::gls::ub::VarType::VarType
                    ((VarType *)&precNdx_1,(DataType)typeName,init::precisionFlags[local_5c].flags);
          createBlockBasicTypeCases
                    ((TestCaseGroup *)pTVar4,pCVar1,pcVar5,(VarType *)&precNdx_1,
                     init::layoutFlags[(int)layoutGroup].flags,0);
          deqp::gls::ub::VarType::~VarType((VarType *)&precNdx_1);
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::allocator<char>::~allocator(&local_c1);
        }
      }
      bVar3 = glu::isDataTypeMatrix((DataType)typeName);
      if (bVar3) {
        for (local_e4 = 0; local_e4 < 2; local_e4 = local_e4 + 1) {
          for (local_e8 = 0; pTVar4 = _type, local_e8 < 3; local_e8 = local_e8 + 1) {
            pCVar1 = (this->super_TestCaseGroup).m_context;
            pcVar5 = init::matrixFlags[local_e4].name;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_188,pcVar5,&local_189);
            std::operator+(&local_168,&local_188,"_");
            std::operator+(&local_148,&local_168,init::precisionFlags[local_e8].name);
            std::operator+(&local_128,&local_148,"_");
            std::operator+(&local_108,&local_128,local_40);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            deqp::gls::ub::VarType::VarType
                      ((VarType *)&singleBasicArrayGroup,(DataType)typeName,
                       init::precisionFlags[local_e8].flags);
            createBlockBasicTypeCases
                      ((TestCaseGroup *)pTVar4,pCVar1,pcVar5,(VarType *)&singleBasicArrayGroup,
                       init::layoutFlags[(int)layoutGroup].flags | init::matrixFlags[local_e4].flags
                       ,0);
            deqp::gls::ub::VarType::~VarType((VarType *)&singleBasicArrayGroup);
            std::__cxx11::string::~string((string *)&local_108);
            std::__cxx11::string::~string((string *)&local_128);
            std::__cxx11::string::~string((string *)&local_148);
            std::__cxx11::string::~string((string *)&local_168);
            std::__cxx11::string::~string((string *)&local_188);
            std::allocator<char>::~allocator(&local_189);
          }
        }
      }
    }
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_basic_array","Single basic array variable in single buffer");
  pTStack_1b0 = pTVar4;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  for (layoutGroup_1._4_4_ = 0; layoutGroup_1._4_4_ < 3;
      layoutGroup_1._4_4_ = layoutGroup_1._4_4_ + 1) {
    pTVar4 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::layoutFlags[layoutGroup_1._4_4_].name,"");
    _type_1 = pTVar4;
    tcu::TestNode::addChild(pTStack_1b0,pTVar4);
    for (typeName_1._4_4_ = 0; typeName_1._4_4_ < 0x19; typeName_1._4_4_ = typeName_1._4_4_ + 1) {
      typeName_1._0_4_ = init::basicTypes[typeName_1._4_4_];
      pcVar5 = glu::getDataTypeName((DataType)typeName_1);
      pTVar4 = _type_1;
      DVar2 = (DataType)typeName_1;
      local_1d4 = 3;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcStack_1d0 = pcVar5;
      bVar3 = glu::isDataTypeBoolOrBVec((DataType)typeName_1);
      deqp::gls::ub::VarType::VarType((VarType *)&stack0xfffffffffffffdf8,DVar2,(uint)!bVar3 << 2);
      deqp::gls::ub::VarType::VarType(&local_1f0,(VarType *)&stack0xfffffffffffffdf8,3);
      createBlockBasicTypeCases
                ((TestCaseGroup *)pTVar4,pCVar1,pcVar5,&local_1f0,
                 init::layoutFlags[layoutGroup_1._4_4_].flags,0);
      deqp::gls::ub::VarType::~VarType(&local_1f0);
      deqp::gls::ub::VarType::~VarType((VarType *)&stack0xfffffffffffffdf8);
      bVar3 = glu::isDataTypeMatrix((DataType)typeName_1);
      if (bVar3) {
        for (local_20c = 0; pTVar4 = _type_1, local_20c < 2; local_20c = local_20c + 1) {
          pCVar1 = (this->super_TestCaseGroup).m_context;
          pcVar5 = init::matrixFlags[local_20c].name;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,pcVar5,&local_271)
          ;
          std::operator+(&local_250,&local_270,"_");
          std::operator+(&local_230,&local_250,pcStack_1d0);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          deqp::gls::ub::VarType::VarType((VarType *)&singleStructGroup,(DataType)typeName_1,4);
          deqp::gls::ub::VarType::VarType(&local_290,(VarType *)&singleStructGroup,3);
          createBlockBasicTypeCases
                    ((TestCaseGroup *)pTVar4,pCVar1,pcVar5,&local_290,
                     init::layoutFlags[layoutGroup_1._4_4_].flags |
                     init::matrixFlags[local_20c].flags,0);
          deqp::gls::ub::VarType::~VarType(&local_290);
          deqp::gls::ub::VarType::~VarType((VarType *)&singleStructGroup);
          std::__cxx11::string::~string((string *)&local_230);
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_270);
          std::allocator<char>::~allocator(&local_271);
        }
      }
    }
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_struct","Single struct in uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  for (modeGroup._4_4_ = 0; modeGroup._4_4_ < 2; modeGroup._4_4_ = modeGroup._4_4_ + 1) {
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferModes[modeGroup._4_4_].name,"");
    tcu::TestNode::addChild(pTVar4,pTVar6);
    for (baseName.field_2._12_4_ = 0; (int)baseName.field_2._12_4_ < 3;
        baseName.field_2._12_4_ = baseName.field_2._12_4_ + 1) {
      for (baseName.field_2._8_4_ = 0; (int)baseName.field_2._8_4_ < 2;
          baseName.field_2._8_4_ = baseName.field_2._8_4_ + 1) {
        pcVar5 = init::layoutFlags[(int)baseName.field_2._12_4_].name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&baseFlags,pcVar5,&local_2e9);
        std::allocator<char>::~allocator(&local_2e9);
        local_2f0 = init::layoutFlags[(int)baseName.field_2._12_4_].flags;
        if ((init::bufferModes[modeGroup._4_4_].mode == BUFFERMODE_SINGLE) &&
           (baseName.field_2._8_4_ == 0)) {
          local_2f4 = 0x22;
        }
        else {
          if (baseName.field_2._8_4_ != 0) {
            std::__cxx11::string::operator+=((string *)&baseFlags,"_instance_array");
          }
          pBVar7 = (BlockSingleStructCase *)operator_new(0xb8);
          local_319 = 1;
          pCVar1 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_318,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &baseFlags,"_vertex");
          pcVar5 = (char *)std::__cxx11::string::c_str();
          BlockSingleStructCase::BlockSingleStructCase
                    (pBVar7,pCVar1,pcVar5,"",local_2f0 | 0x100,
                     init::bufferModes[modeGroup._4_4_].mode,
                     (uint)(baseName.field_2._8_4_ != 0) + (uint)(baseName.field_2._8_4_ != 0) * 2);
          local_319 = 0;
          tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
          std::__cxx11::string::~string((string *)&local_318);
          pBVar7 = (BlockSingleStructCase *)operator_new(0xb8);
          local_341 = 1;
          pCVar1 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_340,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &baseFlags,"_fragment");
          pcVar5 = (char *)std::__cxx11::string::c_str();
          BlockSingleStructCase::BlockSingleStructCase
                    (pBVar7,pCVar1,pcVar5,"",local_2f0 | 0x200,
                     init::bufferModes[modeGroup._4_4_].mode,
                     (uint)(baseName.field_2._8_4_ != 0) + (uint)(baseName.field_2._8_4_ != 0) * 2);
          local_341 = 0;
          tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
          std::__cxx11::string::~string((string *)&local_340);
          if ((local_2f0 & 0x10) == 0) {
            pBVar7 = (BlockSingleStructCase *)operator_new(0xb8);
            pCVar1 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_368,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &baseFlags,"_both");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            BlockSingleStructCase::BlockSingleStructCase
                      (pBVar7,pCVar1,pcVar5,"",local_2f0 | 0x300,
                       init::bufferModes[modeGroup._4_4_].mode,
                       (uint)(baseName.field_2._8_4_ != 0) + (uint)(baseName.field_2._8_4_ != 0) * 2
                      );
            tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar7);
            std::__cxx11::string::~string((string *)&local_368);
          }
          local_2f4 = 0;
        }
        std::__cxx11::string::~string((string *)&baseFlags);
      }
    }
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_struct_array","Struct array in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  for (modeGroup_1._4_4_ = 0; modeGroup_1._4_4_ < 2; modeGroup_1._4_4_ = modeGroup_1._4_4_ + 1) {
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferModes[modeGroup_1._4_4_].name,"");
    tcu::TestNode::addChild(pTVar4,pTVar6);
    for (baseName_1.field_2._12_4_ = 0; (int)baseName_1.field_2._12_4_ < 3;
        baseName_1.field_2._12_4_ = baseName_1.field_2._12_4_ + 1) {
      for (baseName_1.field_2._8_4_ = 0; (int)baseName_1.field_2._8_4_ < 2;
          baseName_1.field_2._8_4_ = baseName_1.field_2._8_4_ + 1) {
        pcVar5 = init::layoutFlags[(int)baseName_1.field_2._12_4_].name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&baseFlags_1,pcVar5,&local_3b1)
        ;
        std::allocator<char>::~allocator(&local_3b1);
        local_3b8 = init::layoutFlags[(int)baseName_1.field_2._12_4_].flags;
        if ((init::bufferModes[modeGroup_1._4_4_].mode == BUFFERMODE_SINGLE) &&
           (baseName_1.field_2._8_4_ == 0)) {
          local_2f4 = 0x2b;
        }
        else {
          if (baseName_1.field_2._8_4_ != 0) {
            std::__cxx11::string::operator+=((string *)&baseFlags_1,"_instance_array");
          }
          pBVar8 = (BlockSingleStructArrayCase *)operator_new(0xb8);
          local_3d9 = 1;
          pCVar1 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_3d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &baseFlags_1,"_vertex");
          pcVar5 = (char *)std::__cxx11::string::c_str();
          BlockSingleStructArrayCase::BlockSingleStructArrayCase
                    (pBVar8,pCVar1,pcVar5,"",local_3b8 | 0x100,
                     init::bufferModes[modeGroup_1._4_4_].mode,
                     (uint)(baseName_1.field_2._8_4_ != 0) +
                     (uint)(baseName_1.field_2._8_4_ != 0) * 2);
          local_3d9 = 0;
          tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar8);
          std::__cxx11::string::~string((string *)&local_3d8);
          pBVar8 = (BlockSingleStructArrayCase *)operator_new(0xb8);
          local_401 = 1;
          pCVar1 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_400,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &baseFlags_1,"_fragment");
          pcVar5 = (char *)std::__cxx11::string::c_str();
          BlockSingleStructArrayCase::BlockSingleStructArrayCase
                    (pBVar8,pCVar1,pcVar5,"",local_3b8 | 0x200,
                     init::bufferModes[modeGroup_1._4_4_].mode,
                     (uint)(baseName_1.field_2._8_4_ != 0) +
                     (uint)(baseName_1.field_2._8_4_ != 0) * 2);
          local_401 = 0;
          tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar8);
          std::__cxx11::string::~string((string *)&local_400);
          if ((local_3b8 & 0x10) == 0) {
            pBVar8 = (BlockSingleStructArrayCase *)operator_new(0xb8);
            pCVar1 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_428,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &baseFlags_1,"_both");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            BlockSingleStructArrayCase::BlockSingleStructArrayCase
                      (pBVar8,pCVar1,pcVar5,"",local_3b8 | 0x300,
                       init::bufferModes[modeGroup_1._4_4_].mode,
                       (uint)(baseName_1.field_2._8_4_ != 0) +
                       (uint)(baseName_1.field_2._8_4_ != 0) * 2);
            tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar8);
            std::__cxx11::string::~string((string *)&local_428);
          }
          local_2f4 = 0;
        }
        std::__cxx11::string::~string((string *)&baseFlags_1);
      }
    }
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_nested_struct","Nested struct in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  for (modeGroup_2._4_4_ = 0; modeGroup_2._4_4_ < 2; modeGroup_2._4_4_ = modeGroup_2._4_4_ + 1) {
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferModes[modeGroup_2._4_4_].name,"");
    tcu::TestNode::addChild(pTVar4,pTVar6);
    for (baseName_2.field_2._12_4_ = 0; (int)baseName_2.field_2._12_4_ < 3;
        baseName_2.field_2._12_4_ = baseName_2.field_2._12_4_ + 1) {
      for (baseName_2.field_2._8_4_ = 0; (int)baseName_2.field_2._8_4_ < 2;
          baseName_2.field_2._8_4_ = baseName_2.field_2._8_4_ + 1) {
        pcVar5 = init::layoutFlags[(int)baseName_2.field_2._12_4_].name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&baseFlags_2,pcVar5,&local_471)
        ;
        std::allocator<char>::~allocator(&local_471);
        local_478 = init::layoutFlags[(int)baseName_2.field_2._12_4_].flags;
        if ((init::bufferModes[modeGroup_2._4_4_].mode == BUFFERMODE_SINGLE) &&
           (baseName_2.field_2._8_4_ == 0)) {
          local_2f4 = 0x34;
        }
        else {
          if (baseName_2.field_2._8_4_ != 0) {
            std::__cxx11::string::operator+=((string *)&baseFlags_2,"_instance_array");
          }
          pBVar9 = (BlockSingleNestedStructCase *)operator_new(0xb8);
          local_499 = 1;
          pCVar1 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_498,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &baseFlags_2,"_vertex");
          pcVar5 = (char *)std::__cxx11::string::c_str();
          BlockSingleNestedStructCase::BlockSingleNestedStructCase
                    (pBVar9,pCVar1,pcVar5,"",local_478 | 0x100,
                     init::bufferModes[modeGroup_2._4_4_].mode,
                     (uint)(baseName_2.field_2._8_4_ != 0) +
                     (uint)(baseName_2.field_2._8_4_ != 0) * 2);
          local_499 = 0;
          tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar9);
          std::__cxx11::string::~string((string *)&local_498);
          pBVar9 = (BlockSingleNestedStructCase *)operator_new(0xb8);
          local_4c1 = 1;
          pCVar1 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_4c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &baseFlags_2,"_fragment");
          pcVar5 = (char *)std::__cxx11::string::c_str();
          BlockSingleNestedStructCase::BlockSingleNestedStructCase
                    (pBVar9,pCVar1,pcVar5,"",local_478 | 0x200,
                     init::bufferModes[modeGroup_2._4_4_].mode,
                     (uint)(baseName_2.field_2._8_4_ != 0) +
                     (uint)(baseName_2.field_2._8_4_ != 0) * 2);
          local_4c1 = 0;
          tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar9);
          std::__cxx11::string::~string((string *)&local_4c0);
          if ((local_478 & 0x10) == 0) {
            pBVar9 = (BlockSingleNestedStructCase *)operator_new(0xb8);
            pCVar1 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_4e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &baseFlags_2,"_both");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            BlockSingleNestedStructCase::BlockSingleNestedStructCase
                      (pBVar9,pCVar1,pcVar5,"",local_478 | 0x300,
                       init::bufferModes[modeGroup_2._4_4_].mode,
                       (uint)(baseName_2.field_2._8_4_ != 0) +
                       (uint)(baseName_2.field_2._8_4_ != 0) * 2);
            tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar9);
            std::__cxx11::string::~string((string *)&local_4e8);
          }
          local_2f4 = 0;
        }
        std::__cxx11::string::~string((string *)&baseFlags_2);
      }
    }
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_nested_struct_array","Nested struct array in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  for (modeGroup_3._4_4_ = 0; modeGroup_3._4_4_ < 2; modeGroup_3._4_4_ = modeGroup_3._4_4_ + 1) {
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferModes[modeGroup_3._4_4_].name,"");
    tcu::TestNode::addChild(pTVar4,pTVar6);
    for (baseName_3.field_2._12_4_ = 0; (int)baseName_3.field_2._12_4_ < 3;
        baseName_3.field_2._12_4_ = baseName_3.field_2._12_4_ + 1) {
      for (baseName_3.field_2._8_4_ = 0; (int)baseName_3.field_2._8_4_ < 2;
          baseName_3.field_2._8_4_ = baseName_3.field_2._8_4_ + 1) {
        pcVar5 = init::layoutFlags[(int)baseName_3.field_2._12_4_].name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&baseFlags_3,pcVar5,&local_531)
        ;
        std::allocator<char>::~allocator(&local_531);
        local_538 = init::layoutFlags[(int)baseName_3.field_2._12_4_].flags;
        if ((init::bufferModes[modeGroup_3._4_4_].mode == BUFFERMODE_SINGLE) &&
           (baseName_3.field_2._8_4_ == 0)) {
          local_2f4 = 0x3d;
        }
        else {
          if (baseName_3.field_2._8_4_ != 0) {
            std::__cxx11::string::operator+=((string *)&baseFlags_3,"_instance_array");
          }
          pBVar10 = (BlockSingleNestedStructArrayCase *)operator_new(0xb8);
          local_559 = 1;
          pCVar1 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_558,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &baseFlags_3,"_vertex");
          pcVar5 = (char *)std::__cxx11::string::c_str();
          BlockSingleNestedStructArrayCase::BlockSingleNestedStructArrayCase
                    (pBVar10,pCVar1,pcVar5,"",local_538 | 0x100,
                     init::bufferModes[modeGroup_3._4_4_].mode,
                     (uint)(baseName_3.field_2._8_4_ != 0) +
                     (uint)(baseName_3.field_2._8_4_ != 0) * 2);
          local_559 = 0;
          tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar10);
          std::__cxx11::string::~string((string *)&local_558);
          pBVar10 = (BlockSingleNestedStructArrayCase *)operator_new(0xb8);
          local_581 = 1;
          pCVar1 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_580,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &baseFlags_3,"_fragment");
          pcVar5 = (char *)std::__cxx11::string::c_str();
          BlockSingleNestedStructArrayCase::BlockSingleNestedStructArrayCase
                    (pBVar10,pCVar1,pcVar5,"",local_538 | 0x200,
                     init::bufferModes[modeGroup_3._4_4_].mode,
                     (uint)(baseName_3.field_2._8_4_ != 0) +
                     (uint)(baseName_3.field_2._8_4_ != 0) * 2);
          local_581 = 0;
          tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar10);
          std::__cxx11::string::~string((string *)&local_580);
          if ((local_538 & 0x10) == 0) {
            pBVar10 = (BlockSingleNestedStructArrayCase *)operator_new(0xb8);
            instanceArrayBasicTypeGroup._7_1_ = 1;
            pCVar1 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_5a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &baseFlags_3,"_both");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            BlockSingleNestedStructArrayCase::BlockSingleNestedStructArrayCase
                      (pBVar10,pCVar1,pcVar5,"",local_538 | 0x300,
                       init::bufferModes[modeGroup_3._4_4_].mode,
                       (uint)(baseName_3.field_2._8_4_ != 0) +
                       (uint)(baseName_3.field_2._8_4_ != 0) * 2);
            instanceArrayBasicTypeGroup._7_1_ = 0;
            tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar10);
            std::__cxx11::string::~string((string *)&local_5a8);
          }
          local_2f4 = 0;
        }
        std::__cxx11::string::~string((string *)&baseFlags_3);
      }
    }
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "instance_array_basic_type","Single basic variable in instance array");
  pTStack_5b8 = pTVar4;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  for (layoutGroup_2._4_4_ = 0; layoutGroup_2._4_4_ < 3;
      layoutGroup_2._4_4_ = layoutGroup_2._4_4_ + 1) {
    pTVar4 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::layoutFlags[layoutGroup_2._4_4_].name,"");
    _type_2 = pTVar4;
    tcu::TestNode::addChild(pTStack_5b8,pTVar4);
    for (typeName_2._4_4_ = 0; typeName_2._4_4_ < 0x19; typeName_2._4_4_ = typeName_2._4_4_ + 1) {
      typeName_2._0_4_ = init::basicTypes[typeName_2._4_4_];
      pcVar5 = glu::getDataTypeName((DataType)typeName_2);
      pTVar4 = _type_2;
      DVar2 = (DataType)typeName_2;
      local_5dc = 3;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcStack_5d8 = pcVar5;
      bVar3 = glu::isDataTypeBoolOrBVec((DataType)typeName_2);
      deqp::gls::ub::VarType::VarType((VarType *)&stack0xfffffffffffffa08,DVar2,(uint)!bVar3 << 2);
      createBlockBasicTypeCases
                ((TestCaseGroup *)pTVar4,pCVar1,pcVar5,(VarType *)&stack0xfffffffffffffa08,
                 init::layoutFlags[layoutGroup_2._4_4_].flags,3);
      deqp::gls::ub::VarType::~VarType((VarType *)&stack0xfffffffffffffa08);
      bVar3 = glu::isDataTypeMatrix((DataType)typeName_2);
      if (bVar3) {
        for (local_5fc = 0; pTVar4 = _type_2, local_5fc < 2; local_5fc = local_5fc + 1) {
          pCVar1 = (this->super_TestCaseGroup).m_context;
          pcVar5 = init::matrixFlags[local_5fc].name;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_660,pcVar5,&local_661)
          ;
          std::operator+(&local_640,&local_660,"_");
          std::operator+(&local_620,&local_640,pcStack_5d8);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          deqp::gls::ub::VarType::VarType((VarType *)&multiBasicTypesGroup,(DataType)typeName_2,4);
          createBlockBasicTypeCases
                    ((TestCaseGroup *)pTVar4,pCVar1,pcVar5,(VarType *)&multiBasicTypesGroup,
                     init::layoutFlags[layoutGroup_2._4_4_].flags |
                     init::matrixFlags[local_5fc].flags,3);
          deqp::gls::ub::VarType::~VarType((VarType *)&multiBasicTypesGroup);
          std::__cxx11::string::~string((string *)&local_620);
          std::__cxx11::string::~string((string *)&local_640);
          std::__cxx11::string::~string((string *)&local_660);
          std::allocator<char>::~allocator(&local_661);
        }
      }
    }
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "multi_basic_types","Multiple buffers with basic types");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  for (modeGroup_4._4_4_ = 0; modeGroup_4._4_4_ < 2; modeGroup_4._4_4_ = modeGroup_4._4_4_ + 1) {
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferModes[modeGroup_4._4_4_].name,"");
    tcu::TestNode::addChild(pTVar4,pTVar6);
    for (baseName_4.field_2._12_4_ = 0; (int)baseName_4.field_2._12_4_ < 3;
        baseName_4.field_2._12_4_ = baseName_4.field_2._12_4_ + 1) {
      for (baseName_4.field_2._8_4_ = 0; (int)baseName_4.field_2._8_4_ < 2;
          baseName_4.field_2._8_4_ = baseName_4.field_2._8_4_ + 1) {
        pcVar5 = init::layoutFlags[(int)baseName_4.field_2._12_4_].name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&baseFlags_4,pcVar5,&local_6c1)
        ;
        std::allocator<char>::~allocator(&local_6c1);
        local_6c8 = init::layoutFlags[(int)baseName_4.field_2._12_4_].flags;
        if (baseName_4.field_2._8_4_ != 0) {
          std::__cxx11::string::operator+=((string *)&baseFlags_4,"_instance_array");
        }
        pBVar11 = (BlockMultiBasicTypesCase *)operator_new(0xc0);
        local_6e9 = 1;
        pCVar1 = (this->super_TestCaseGroup).m_context;
        std::operator+(&local_6e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &baseFlags_4,"_vertex");
        pcVar5 = (char *)std::__cxx11::string::c_str();
        BlockMultiBasicTypesCase::BlockMultiBasicTypesCase
                  (pBVar11,pCVar1,pcVar5,"",local_6c8 | 0x100,local_6c8 | 0x100,
                   init::bufferModes[modeGroup_4._4_4_].mode,
                   (uint)(baseName_4.field_2._8_4_ != 0) + (uint)(baseName_4.field_2._8_4_ != 0) * 2
                  );
        local_6e9 = 0;
        tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar11);
        std::__cxx11::string::~string((string *)&local_6e8);
        pBVar11 = (BlockMultiBasicTypesCase *)operator_new(0xc0);
        local_711 = 1;
        pCVar1 = (this->super_TestCaseGroup).m_context;
        std::operator+(&local_710,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &baseFlags_4,"_fragment");
        pcVar5 = (char *)std::__cxx11::string::c_str();
        BlockMultiBasicTypesCase::BlockMultiBasicTypesCase
                  (pBVar11,pCVar1,pcVar5,"",local_6c8 | 0x200,local_6c8 | 0x200,
                   init::bufferModes[modeGroup_4._4_4_].mode,
                   (uint)(baseName_4.field_2._8_4_ != 0) + (uint)(baseName_4.field_2._8_4_ != 0) * 2
                  );
        local_711 = 0;
        tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar11);
        std::__cxx11::string::~string((string *)&local_710);
        if ((local_6c8 & 0x10) == 0) {
          pBVar11 = (BlockMultiBasicTypesCase *)operator_new(0xc0);
          local_739 = 1;
          pCVar1 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_738,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &baseFlags_4,"_both");
          pcVar5 = (char *)std::__cxx11::string::c_str();
          BlockMultiBasicTypesCase::BlockMultiBasicTypesCase
                    (pBVar11,pCVar1,pcVar5,"",local_6c8 | 0x300,local_6c8 | 0x300,
                     init::bufferModes[modeGroup_4._4_4_].mode,
                     (uint)(baseName_4.field_2._8_4_ != 0) +
                     (uint)(baseName_4.field_2._8_4_ != 0) * 2);
          local_739 = 0;
          tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar11);
          std::__cxx11::string::~string((string *)&local_738);
        }
        pBVar11 = (BlockMultiBasicTypesCase *)operator_new(0xc0);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        std::operator+(&local_760,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &baseFlags_4,"_mixed");
        pcVar5 = (char *)std::__cxx11::string::c_str();
        BlockMultiBasicTypesCase::BlockMultiBasicTypesCase
                  (pBVar11,pCVar1,pcVar5,"",local_6c8 | 0x100,local_6c8 | 0x200,
                   init::bufferModes[modeGroup_4._4_4_].mode,
                   (uint)(baseName_4.field_2._8_4_ != 0) + (uint)(baseName_4.field_2._8_4_ != 0) * 2
                  );
        tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar11);
        std::__cxx11::string::~string((string *)&local_760);
        std::__cxx11::string::~string((string *)&baseFlags_4);
      }
    }
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "multi_nested_struct","Multiple buffers with nested structs");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  for (modeGroup_5._4_4_ = 0; modeGroup_5._4_4_ < 2; modeGroup_5._4_4_ = modeGroup_5._4_4_ + 1) {
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferModes[modeGroup_5._4_4_].name,"");
    tcu::TestNode::addChild(pTVar4,pTVar6);
    for (baseName_5.field_2._12_4_ = 0; (int)baseName_5.field_2._12_4_ < 3;
        baseName_5.field_2._12_4_ = baseName_5.field_2._12_4_ + 1) {
      for (baseName_5.field_2._8_4_ = 0; (int)baseName_5.field_2._8_4_ < 2;
          baseName_5.field_2._8_4_ = baseName_5.field_2._8_4_ + 1) {
        pcVar5 = init::layoutFlags[(int)baseName_5.field_2._12_4_].name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&baseFlags_5,pcVar5,&local_7a9)
        ;
        std::allocator<char>::~allocator(&local_7a9);
        local_7b0 = init::layoutFlags[(int)baseName_5.field_2._12_4_].flags;
        if (baseName_5.field_2._8_4_ != 0) {
          std::__cxx11::string::operator+=((string *)&baseFlags_5,"_instance_array");
        }
        pBVar12 = (BlockMultiNestedStructCase *)operator_new(0xc0);
        local_7d1 = 1;
        pCVar1 = (this->super_TestCaseGroup).m_context;
        std::operator+(&local_7d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &baseFlags_5,"_vertex");
        pcVar5 = (char *)std::__cxx11::string::c_str();
        BlockMultiNestedStructCase::BlockMultiNestedStructCase
                  (pBVar12,pCVar1,pcVar5,"",local_7b0 | 0x100,local_7b0 | 0x100,
                   init::bufferModes[modeGroup_5._4_4_].mode,
                   (uint)(baseName_5.field_2._8_4_ != 0) + (uint)(baseName_5.field_2._8_4_ != 0) * 2
                  );
        local_7d1 = 0;
        tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar12);
        std::__cxx11::string::~string((string *)&local_7d0);
        pBVar12 = (BlockMultiNestedStructCase *)operator_new(0xc0);
        local_7f9 = 1;
        pCVar1 = (this->super_TestCaseGroup).m_context;
        std::operator+(&local_7f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &baseFlags_5,"_fragment");
        pcVar5 = (char *)std::__cxx11::string::c_str();
        BlockMultiNestedStructCase::BlockMultiNestedStructCase
                  (pBVar12,pCVar1,pcVar5,"",local_7b0 | 0x200,local_7b0 | 0x200,
                   init::bufferModes[modeGroup_5._4_4_].mode,
                   (uint)(baseName_5.field_2._8_4_ != 0) + (uint)(baseName_5.field_2._8_4_ != 0) * 2
                  );
        local_7f9 = 0;
        tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar12);
        std::__cxx11::string::~string((string *)&local_7f8);
        if ((local_7b0 & 0x10) == 0) {
          pBVar12 = (BlockMultiNestedStructCase *)operator_new(0xc0);
          local_821 = 1;
          pCVar1 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_820,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &baseFlags_5,"_both");
          pcVar5 = (char *)std::__cxx11::string::c_str();
          BlockMultiNestedStructCase::BlockMultiNestedStructCase
                    (pBVar12,pCVar1,pcVar5,"",local_7b0 | 0x300,local_7b0 | 0x300,
                     init::bufferModes[modeGroup_5._4_4_].mode,
                     (uint)(baseName_5.field_2._8_4_ != 0) +
                     (uint)(baseName_5.field_2._8_4_ != 0) * 2);
          local_821 = 0;
          tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar12);
          std::__cxx11::string::~string((string *)&local_820);
        }
        pBVar12 = (BlockMultiNestedStructCase *)operator_new(0xc0);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &allShaders,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &baseFlags_5,"_mixed");
        pcVar5 = (char *)std::__cxx11::string::c_str();
        BlockMultiNestedStructCase::BlockMultiNestedStructCase
                  (pBVar12,pCVar1,pcVar5,"",local_7b0 | 0x100,local_7b0 | 0x200,
                   init::bufferModes[modeGroup_5._4_4_].mode,
                   (uint)(baseName_5.field_2._8_4_ != 0) + (uint)(baseName_5.field_2._8_4_ != 0) * 2
                  );
        tcu::TestNode::addChild(pTVar6,(TestNode *)pBVar12);
        std::__cxx11::string::~string((string *)&allShaders);
        std::__cxx11::string::~string((string *)&baseFlags_5);
      }
    }
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"random",
             "Random Uniform Block cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar4,(this->super_TestCaseGroup).m_context,"scalar_types",
             "Scalar types only, per-block buffers",BUFFERMODE_PER_BLOCK,0x3fc0,0x19,0);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar4,(this->super_TestCaseGroup).m_context,"vector_types",
             "Scalar and vector types only, per-block buffers",BUFFERMODE_PER_BLOCK,0x3fc1,0x19,0x19
            );
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar4,(this->super_TestCaseGroup).m_context,"basic_types",
             "All basic types, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fc3,0x19,0x32);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar4,(this->super_TestCaseGroup).m_context,"basic_arrays",
             "Arrays, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fc7,0x19,0x32);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar4,(this->super_TestCaseGroup).m_context,"basic_instance_arrays",
             "Basic instance arrays, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fe3,0x19,0x4b);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar4,(this->super_TestCaseGroup).m_context,"nested_structs",
             "Nested structs, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fcb,0x19,100);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar4,(this->super_TestCaseGroup).m_context,"nested_structs_arrays",
             "Nested structs, arrays, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fcf,0x19,0x96);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar4,(this->super_TestCaseGroup).m_context,
             "nested_structs_instance_arrays","Nested structs, instance arrays, per-block buffers",
             BUFFERMODE_PER_BLOCK,0x7feb,0x19,0x7d);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar4,(this->super_TestCaseGroup).m_context,
             "nested_structs_arrays_instance_arrays",
             "Nested structs, instance arrays, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fef,0x19,
             0xaf);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar4,(this->super_TestCaseGroup).m_context,"all_per_block_buffers",
             "All random features, per-block buffers",BUFFERMODE_PER_BLOCK,0xffff7fff,0x32,200);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar4,(this->super_TestCaseGroup).m_context,"all_shared_buffer",
             "All random features, shared buffer",BUFFERMODE_SINGLE,0xffff7fff,0x32,0xfa);
  return extraout_EAX;
}

Assistant:

void UniformBlockTests::init (void)
{
	static const glu::DataType basicTypes[] =
	{
		glu::TYPE_FLOAT,
		glu::TYPE_FLOAT_VEC2,
		glu::TYPE_FLOAT_VEC3,
		glu::TYPE_FLOAT_VEC4,
		glu::TYPE_INT,
		glu::TYPE_INT_VEC2,
		glu::TYPE_INT_VEC3,
		glu::TYPE_INT_VEC4,
		glu::TYPE_UINT,
		glu::TYPE_UINT_VEC2,
		glu::TYPE_UINT_VEC3,
		glu::TYPE_UINT_VEC4,
		glu::TYPE_BOOL,
		glu::TYPE_BOOL_VEC2,
		glu::TYPE_BOOL_VEC3,
		glu::TYPE_BOOL_VEC4,
		glu::TYPE_FLOAT_MAT2,
		glu::TYPE_FLOAT_MAT3,
		glu::TYPE_FLOAT_MAT4,
		glu::TYPE_FLOAT_MAT2X3,
		glu::TYPE_FLOAT_MAT2X4,
		glu::TYPE_FLOAT_MAT3X2,
		glu::TYPE_FLOAT_MAT3X4,
		glu::TYPE_FLOAT_MAT4X2,
		glu::TYPE_FLOAT_MAT4X3
	};

	static const struct
	{
		const char*		name;
		deUint32		flags;
	} precisionFlags[] =
	{
		{ "lowp",		PRECISION_LOW		},
		{ "mediump",	PRECISION_MEDIUM	},
		{ "highp",		PRECISION_HIGH		}
	};

	static const struct
	{
		const char*		name;
		deUint32		flags;
	} layoutFlags[] =
	{
		{ "shared",		LAYOUT_SHARED	},
		{ "packed",		LAYOUT_PACKED	},
		{ "std140",		LAYOUT_STD140	}
	};

	static const struct
	{
		const char*		name;
		deUint32		flags;
	} matrixFlags[] =
	{
		{ "row_major",		LAYOUT_ROW_MAJOR	},
		{ "column_major",	LAYOUT_COLUMN_MAJOR }
	};

	static const struct
	{
		const char*							name;
		UniformBlockCase::BufferMode		mode;
	} bufferModes[] =
	{
		{ "per_block_buffer",	UniformBlockCase::BUFFERMODE_PER_BLOCK },
		{ "single_buffer",		UniformBlockCase::BUFFERMODE_SINGLE	}
	};

	// ubo.single_basic_type
	{
		tcu::TestCaseGroup* singleBasicTypeGroup = new tcu::TestCaseGroup(m_testCtx, "single_basic_type", "Single basic variable in single buffer");
		addChild(singleBasicTypeGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			singleBasicTypeGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType	type		= basicTypes[basicTypeNdx];
				const char*		typeName	= glu::getDataTypeName(type);

				if (glu::isDataTypeBoolOrBVec(type))
					createBlockBasicTypeCases(layoutGroup, m_context, typeName, VarType(type, 0), layoutFlags[layoutFlagNdx].flags);
				else
				{
					for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisionFlags); precNdx++)
						createBlockBasicTypeCases(layoutGroup, m_context, (string(precisionFlags[precNdx].name) + "_" + typeName).c_str(),
												  VarType(type, precisionFlags[precNdx].flags), layoutFlags[layoutFlagNdx].flags);
				}

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
					{
						for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisionFlags); precNdx++)
							createBlockBasicTypeCases(layoutGroup, m_context, (string(matrixFlags[matFlagNdx].name) + "_" + precisionFlags[precNdx].name + "_" + typeName).c_str(),
													  VarType(type, precisionFlags[precNdx].flags), layoutFlags[layoutFlagNdx].flags|matrixFlags[matFlagNdx].flags);
					}
				}
			}
		}
	}

	// ubo.single_basic_array
	{
		tcu::TestCaseGroup* singleBasicArrayGroup = new tcu::TestCaseGroup(m_testCtx, "single_basic_array", "Single basic array variable in single buffer");
		addChild(singleBasicArrayGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			singleBasicArrayGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType	type		= basicTypes[basicTypeNdx];
				const char*		typeName	= glu::getDataTypeName(type);
				const int		arraySize	= 3;

				createBlockBasicTypeCases(layoutGroup, m_context, typeName,
										  VarType(VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH), arraySize),
										  layoutFlags[layoutFlagNdx].flags);

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						createBlockBasicTypeCases(layoutGroup, m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(),
												  VarType(VarType(type, PRECISION_HIGH), arraySize),
												  layoutFlags[layoutFlagNdx].flags|matrixFlags[matFlagNdx].flags);
				}
			}
		}
	}

	// ubo.single_struct
	{
		tcu::TestCaseGroup* singleStructGroup = new tcu::TestCaseGroup(m_testCtx, "single_struct", "Single struct in uniform block");
		addChild(singleStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			singleStructGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockSingleStructCase(m_context, (baseName + "_vertex").c_str(),	"", baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockSingleStructCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockSingleStructCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_struct_array
	{
		tcu::TestCaseGroup* singleStructArrayGroup = new tcu::TestCaseGroup(m_testCtx, "single_struct_array", "Struct array in one uniform block");
		addChild(singleStructArrayGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			singleStructArrayGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockSingleStructArrayCase(m_context, (baseName + "_vertex").c_str(),	"", baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockSingleStructArrayCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockSingleStructArrayCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_nested_struct
	{
		tcu::TestCaseGroup* singleNestedStructGroup = new tcu::TestCaseGroup(m_testCtx, "single_nested_struct", "Nested struct in one uniform block");
		addChild(singleNestedStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			singleNestedStructGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockSingleNestedStructCase(m_context, (baseName + "_vertex").c_str(),		"", baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockSingleNestedStructCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockSingleNestedStructCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_nested_struct_array
	{
		tcu::TestCaseGroup* singleNestedStructArrayGroup = new tcu::TestCaseGroup(m_testCtx, "single_nested_struct_array", "Nested struct array in one uniform block");
		addChild(singleNestedStructArrayGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			singleNestedStructArrayGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockSingleNestedStructArrayCase(m_context, (baseName + "_vertex").c_str(),		"", baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockSingleNestedStructArrayCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockSingleNestedStructArrayCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.instance_array_basic_type
	{
		tcu::TestCaseGroup* instanceArrayBasicTypeGroup = new tcu::TestCaseGroup(m_testCtx, "instance_array_basic_type", "Single basic variable in instance array");
		addChild(instanceArrayBasicTypeGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			instanceArrayBasicTypeGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType	type			= basicTypes[basicTypeNdx];
				const char*		typeName		= glu::getDataTypeName(type);
				const int		numInstances	= 3;

				createBlockBasicTypeCases(layoutGroup, m_context, typeName,
										  VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH),
										  layoutFlags[layoutFlagNdx].flags, numInstances);

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						createBlockBasicTypeCases(layoutGroup, m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(),
												  VarType(type, PRECISION_HIGH), layoutFlags[layoutFlagNdx].flags|matrixFlags[matFlagNdx].flags,
												  numInstances);
				}
			}
		}
	}

	// ubo.multi_basic_types
	{
		tcu::TestCaseGroup* multiBasicTypesGroup = new tcu::TestCaseGroup(m_testCtx, "multi_basic_types", "Multiple buffers with basic types");
		addChild(multiBasicTypesGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			multiBasicTypesGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockMultiBasicTypesCase(m_context, (baseName + "_vertex").c_str(),		"", baseFlags|DECLARE_VERTEX,					baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockMultiBasicTypesCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockMultiBasicTypesCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));

					modeGroup->addChild(new BlockMultiBasicTypesCase(m_context, (baseName + "_mixed").c_str(),		"", baseFlags|DECLARE_VERTEX,					baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.multi_nested_struct
	{
		tcu::TestCaseGroup* multiNestedStructGroup = new tcu::TestCaseGroup(m_testCtx, "multi_nested_struct", "Multiple buffers with nested structs");
		addChild(multiNestedStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			multiNestedStructGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockMultiNestedStructCase(m_context, (baseName + "_vertex").c_str(),	"", baseFlags|DECLARE_VERTEX,					baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockMultiNestedStructCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockMultiNestedStructCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));

					modeGroup->addChild(new BlockMultiNestedStructCase(m_context, (baseName + "_mixed").c_str(),	"", baseFlags|DECLARE_VERTEX,					baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.random
	{
		const deUint32	allShaders		= FEATURE_VERTEX_BLOCKS|FEATURE_FRAGMENT_BLOCKS|FEATURE_SHARED_BLOCKS;
		const deUint32	allLayouts		= FEATURE_PACKED_LAYOUT|FEATURE_SHARED_LAYOUT|FEATURE_STD140_LAYOUT;
		const deUint32	allBasicTypes	= FEATURE_VECTORS|FEATURE_MATRICES;
		const deUint32	unused			= FEATURE_UNUSED_MEMBERS|FEATURE_UNUSED_UNIFORMS;
		const deUint32	matFlags		= FEATURE_MATRIX_LAYOUT;
		const deUint32	allFeatures		= ~FEATURE_ARRAYS_OF_ARRAYS;

		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Random Uniform Block cases");
		addChild(randomGroup);

		// Basic types.
		createRandomCaseGroup(randomGroup, m_context, "scalar_types",	"Scalar types only, per-block buffers",				UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused,										25, 0);
		createRandomCaseGroup(randomGroup, m_context, "vector_types",	"Scalar and vector types only, per-block buffers",	UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|FEATURE_VECTORS,						25, 25);
		createRandomCaseGroup(randomGroup, m_context, "basic_types",	"All basic types, per-block buffers",				UniformBlockCase::BUFFERMODE_PER_BLOCK, allShaders|allLayouts|unused|allBasicTypes|matFlags,				25, 50);
		createRandomCaseGroup(randomGroup, m_context, "basic_arrays",	"Arrays, per-block buffers",						UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_ARRAYS,	25, 50);

		createRandomCaseGroup(randomGroup, m_context, "basic_instance_arrays",					"Basic instance arrays, per-block buffers",				UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_INSTANCE_ARRAYS,								25, 75);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs",							"Nested structs, per-block buffers",					UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_STRUCTS,										25, 100);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs_arrays",					"Nested structs, arrays, per-block buffers",			UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_STRUCTS|FEATURE_ARRAYS,							25, 150);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs_instance_arrays",			"Nested structs, instance arrays, per-block buffers",	UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_STRUCTS|FEATURE_INSTANCE_ARRAYS,				25, 125);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs_arrays_instance_arrays",	"Nested structs, instance arrays, per-block buffers",	UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_STRUCTS|FEATURE_ARRAYS|FEATURE_INSTANCE_ARRAYS,	25, 175);

		createRandomCaseGroup(randomGroup, m_context, "all_per_block_buffers",	"All random features, per-block buffers",	UniformBlockCase::BUFFERMODE_PER_BLOCK,	allFeatures,	50, 200);
		createRandomCaseGroup(randomGroup, m_context, "all_shared_buffer",		"All random features, shared buffer",		UniformBlockCase::BUFFERMODE_SINGLE,	allFeatures,	50, 250);
	}
}